

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
__thiscall duckdb::ClientContext::LockContext(ClientContext *this)

{
  long in_RSI;
  
  make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)this,(mutex *)(in_RSI + 0x240));
  return (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
         (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
         this;
}

Assistant:

unique_ptr<ClientContextLock> ClientContext::LockContext() {
	return make_uniq<ClientContextLock>(context_lock);
}